

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::make
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *this,string *name,
          TextureType texType)

{
  Texture *this_00;
  mapped_type *this_01;
  SharedPtr<deqp::gls::LongStressCaseInternal::Texture> local_30;
  
  this_00 = (Texture *)operator_new(0x14);
  Texture::Texture(this_00,texType);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>::SharedPtr(&local_30,this_00);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
            ::operator[](&this->m_objects,name);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>::operator=(this_01,&local_30);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>::release(&local_30);
  return;
}

Assistant:

void						make						(const string& name, gls::TextureType texType)		{ DE_ASSERT(!has(name)); m_objects[name] = SharedPtr<T>(new T(texType)); }